

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O2

void __thiscall Assimp::EmbedTexturesProcess::Execute(EmbedTexturesProcess *this,aiScene *pScene)

{
  aiMaterial *pMat;
  bool bVar1;
  uint uVar2;
  Logger *this_00;
  ulong uVar3;
  uint index;
  aiTextureType type;
  char *local_5f0 [4];
  string local_5d0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  aiString path;
  
  if ((pScene != (aiScene *)0x0) && (pScene->mRootNode != (aiNode *)0x0)) {
    path.length = 0;
    path.data[0] = '\0';
    memset(path.data + 1,0x1b,0x3ff);
    for (uVar3 = 0; uVar3 < pScene->mNumMaterials; uVar3 = uVar3 + 1) {
      pMat = pScene->mMaterials[uVar3];
      for (type = aiTextureType_DIFFUSE; type != aiTextureType_UNKNOWN;
          type = type + aiTextureType_DIFFUSE) {
        uVar2 = aiGetMaterialTextureCount(pMat,type);
        for (index = 0; uVar2 != index; index = index + 1) {
          aiMaterial::GetTexture
                    (pMat,type,index,&path,(aiTextureMapping *)0x0,(uint *)0x0,(ai_real *)0x0,
                     (aiTextureOp *)0x0,(aiTextureMapMode *)0x0);
          if (path.data[0] != '*') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5d0,path.data,(allocator<char> *)&local_5b0);
            bVar1 = addTexture(this,pScene,&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            if (bVar1) {
              snprintf(path.data,0x400,"*%u",(ulong)(pScene->mNumTextures - 1));
              aiMaterial::AddProperty(pMat,&path,"$tex.file",type,index);
            }
          }
        }
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[41]>(&local_5b0,(char (*) [41])"EmbedTexturesProcess finished. Embedded ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
    std::operator<<((ostream *)&local_5b0," textures.");
    std::__cxx11::stringbuf::str();
    Logger::info(this_00,local_5f0[0]);
    std::__cxx11::string::~string((string *)local_5f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
  }
  return;
}

Assistant:

void EmbedTexturesProcess::Execute(aiScene* pScene) {
    if (pScene == nullptr || pScene->mRootNode == nullptr) return;

    aiString path;

    uint32_t embeddedTexturesCount = 0u;

    for (auto matId = 0u; matId < pScene->mNumMaterials; ++matId) {
        auto material = pScene->mMaterials[matId];

        for (auto ttId = 1u; ttId < AI_TEXTURE_TYPE_MAX; ++ttId) {
            auto tt = static_cast<aiTextureType>(ttId);
            auto texturesCount = material->GetTextureCount(tt);

            for (auto texId = 0u; texId < texturesCount; ++texId) {
                material->GetTexture(tt, texId, &path);
                if (path.data[0] == '*') continue; // Already embedded

                // Indeed embed
                if (addTexture(pScene, path.data)) {
                    auto embeddedTextureId = pScene->mNumTextures - 1u;
                    ::ai_snprintf(path.data, 1024, "*%u", embeddedTextureId);
                    material->AddProperty(&path, AI_MATKEY_TEXTURE(tt, texId));
                    embeddedTexturesCount++;
                }
            }
        }
    }

    ASSIMP_LOG_INFO_F("EmbedTexturesProcess finished. Embedded ", embeddedTexturesCount, " textures." );
}